

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

void Str_MuxCreate(Str_Mux_t *pTree,Str_Ntk_t *pNtk,int iMux,int nMuxes,Vec_Int_t *vDelay,
                  int nLutSize)

{
  int iVar1;
  Str_Mux_t *pSVar2;
  Str_Obj_t *pObj_00;
  Str_Obj_t *pSVar3;
  int local_4c;
  int local_48;
  int nPis;
  int k;
  int i;
  Str_Mux_t *pMux;
  Str_Obj_t *pObj;
  int nLutSize_local;
  Vec_Int_t *vDelay_local;
  int nMuxes_local;
  int iMux_local;
  Str_Ntk_t *pNtk_local;
  Str_Mux_t *pTree_local;
  
  local_4c = 0;
  if (nMuxes < 2) {
    __assert_fail("nMuxes >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                  ,0x5da,"void Str_MuxCreate(Str_Mux_t *, Str_Ntk_t *, int, int, Vec_Int_t *, int)")
    ;
  }
  memset(pTree,0,(long)(nMuxes + 1) << 6);
  pTree->nLutSize = nLutSize;
  pTree->Edge[0].Fan = 1;
  nPis = 1;
  while( true ) {
    if (nMuxes < nPis) {
      return;
    }
    pSVar2 = pTree + nPis;
    pSVar2->Id = nPis;
    pSVar2->nLutSize = nLutSize;
    pSVar2->Copy = -1;
    pSVar2->Delay = -1;
    pObj_00 = Str_NtkObj(pNtk,(iMux + nMuxes) - nPis);
    if (((undefined1  [16])*pObj_00 & (undefined1  [16])0xf) != (undefined1  [16])0x5) break;
    for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
      iVar1 = Str_ObjFaninC(pNtk,pObj_00,local_48);
      pSVar2->Edge[local_48].fCompl = iVar1;
      iVar1 = Str_ObjFaninId(pNtk,pObj_00,local_48);
      if (iVar1 < iMux) {
        pSVar2->Edge[local_48].Fan = -local_4c;
        pSVar3 = Str_ObjFanin(pNtk,pObj_00,local_48);
        pSVar2->Edge[local_48].Copy = pSVar3->iCopy;
        iVar1 = Abc_Lit2Var(pSVar2->Edge[local_48].Copy);
        iVar1 = Vec_IntEntry(vDelay,iVar1);
        pSVar2->Edge[local_48].FanDel = iVar1;
        local_4c = local_4c + 1;
      }
      else {
        iVar1 = Str_ObjFaninId(pNtk,pObj_00,local_48);
        pSVar2->Edge[local_48].Fan = (iMux + nMuxes) - iVar1;
      }
    }
    nPis = nPis + 1;
  }
  __assert_fail("pObj->Type == STR_MUX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                ,0x5e6,"void Str_MuxCreate(Str_Mux_t *, Str_Ntk_t *, int, int, Vec_Int_t *, int)");
}

Assistant:

void Str_MuxCreate( Str_Mux_t * pTree, Str_Ntk_t * pNtk, int iMux, int nMuxes, Vec_Int_t * vDelay, int nLutSize )
{
    Str_Obj_t * pObj;
    Str_Mux_t * pMux;
    int i, k, nPis = 0;
    assert( nMuxes >= 2 );
    memset( pTree, 0, sizeof(Str_Mux_t) * (nMuxes + 1) );
    pTree->nLutSize = nLutSize;
    pTree->Edge[0].Fan = 1;
    for ( i = 1; i <= nMuxes; i++ )
    {
        pMux = pTree + i;
        pMux->Id = i;
        pMux->nLutSize = nLutSize;
        pMux->Delay = pMux->Copy = -1;
        // assign fanins
        pObj = Str_NtkObj( pNtk, iMux + nMuxes - i );
        assert( pObj->Type == STR_MUX );
        for ( k = 0; k < 3; k++ )
        {
            pMux->Edge[k].fCompl = Str_ObjFaninC(pNtk, pObj, k);
            if ( Str_ObjFaninId(pNtk, pObj, k) >= iMux )
                pMux->Edge[k].Fan = iMux + nMuxes - Str_ObjFaninId(pNtk, pObj, k);
            else
            {
                pMux->Edge[k].Fan = -nPis++; // count external inputs, including controls
                pMux->Edge[k].Copy = Str_ObjFanin(pNtk, pObj, k)->iCopy;
                pMux->Edge[k].FanDel = Vec_IntEntry( vDelay, Abc_Lit2Var(pMux->Edge[k].Copy) );
            }
        }
    }
}